

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20> * __thiscall
VulkanUtilities::VulkanLogicalDevice::
CreateVulkanObject<VkQueryPool_T*,(VulkanUtilities::VulkanHandleTypeId)20,VkResult(*)(VkDevice_T*,VkQueryPoolCreateInfo_const*,VkAllocationCallbacks_const*,VkQueryPool_T**),VkQueryPoolCreateInfo>
          (VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>
           *__return_storage_ptr__,VulkanLogicalDevice *this,
          _func_VkResult_VkDevice_T_ptr_VkQueryPoolCreateInfo_ptr_VkAllocationCallbacks_ptr_VkQueryPool_T_ptr_ptr
          *VkCreateObject,VkQueryPoolCreateInfo *CreateInfo,char *DebugName,char *ObjectType)

{
  undefined1 local_70 [32];
  VkQueryPool pVStack_50;
  VkResult err;
  VkQueryPool_T *VkObject;
  char *ObjectType_local;
  char *DebugName_local;
  VkQueryPoolCreateInfo *CreateInfo_local;
  _func_VkResult_VkDevice_T_ptr_VkQueryPoolCreateInfo_ptr_VkAllocationCallbacks_ptr_VkQueryPool_T_ptr_ptr
  *VkCreateObject_local;
  VulkanLogicalDevice *this_local;
  
  ObjectType_local = DebugName;
  if (DebugName == (char *)0x0) {
    ObjectType_local = "";
  }
  pVStack_50 = (VkQueryPool)0x0;
  VkObject = (VkQueryPool_T *)ObjectType;
  DebugName_local = (char *)CreateInfo;
  CreateInfo_local = (VkQueryPoolCreateInfo *)VkCreateObject;
  VkCreateObject_local =
       (_func_VkResult_VkDevice_T_ptr_VkQueryPoolCreateInfo_ptr_VkAllocationCallbacks_ptr_VkQueryPool_T_ptr_ptr
        *)this;
  this_local = (VulkanLogicalDevice *)__return_storage_ptr__;
  local_70._28_4_ =
       (*VkCreateObject)(this->m_VkDevice,CreateInfo,this->m_VkAllocator,&stack0xffffffffffffffb0);
  if (local_70._28_4_ != VK_SUCCESS) {
    local_70[0x1b] = 0x27;
    local_70._16_8_ = VkResultToString(local_70._28_4_);
    Diligent::LogError<true,char[25],char_const*,char[3],char_const*,char,char[17],char_const*>
              (false,"CreateVulkanObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xad,(char (*) [25])"Failed to create Vulkan ",(char **)&VkObject,
               (char (*) [3])0xc06dfc,&ObjectType_local,local_70 + 0x1b,
               (char (*) [17])"\nVK Error Code: ",(char **)(local_70 + 0x10));
  }
  if (*ObjectType_local != '\0') {
    SetVulkanObjectName<VkQueryPool_T*,(VulkanUtilities::VulkanHandleTypeId)20>
              (this->m_VkDevice,pVStack_50,ObjectType_local);
  }
  GetSharedPtr((VulkanLogicalDevice *)local_70);
  VulkanObjectWrapper<VkQueryPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)20>::VulkanObjectWrapper
            (__return_storage_ptr__,
             (shared_ptr<const_VulkanUtilities::VulkanLogicalDevice> *)local_70,
             &stack0xffffffffffffffb0);
  std::shared_ptr<const_VulkanUtilities::VulkanLogicalDevice>::~shared_ptr
            ((shared_ptr<const_VulkanUtilities::VulkanLogicalDevice> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

VulkanObjectWrapper<VkObjectType, VkTypeId> VulkanLogicalDevice::CreateVulkanObject(VkCreateObjectFuncType        VkCreateObject,
                                                                                    const VkObjectCreateInfoType& CreateInfo,
                                                                                    const char*                   DebugName,
                                                                                    const char*                   ObjectType) const
{
    if (DebugName == nullptr)
        DebugName = "";

    VkObjectType VkObject = VK_NULL_HANDLE;

    VkResult err = VkCreateObject(m_VkDevice, &CreateInfo, m_VkAllocator, &VkObject);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create Vulkan ", ObjectType, " '", DebugName, '\'');

    if (*DebugName != 0)
        SetVulkanObjectName<VkObjectType, VkTypeId>(m_VkDevice, VkObject, DebugName);

    return VulkanObjectWrapper<VkObjectType, VkTypeId>{GetSharedPtr(), std::move(VkObject)};
}